

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void CVmBifTADS::get_func_params(uint argc)

{
  int iVar1;
  vm_obj_id_t obj;
  CVmObjList *this;
  CVmFuncPtr hdr;
  vm_val_t val;
  CVmFuncPtr local_38;
  vm_val_t local_30;
  
  CVmBif::check_argc(argc,1);
  local_38.p_ = (byte *)0x0;
  iVar1 = CVmFuncPtr::set(&local_38,sp_ + -1);
  if (iVar1 != 0) {
    obj = CVmObjList::create(0,3);
    this = (CVmObjList *)
           ((long)&G_obj_table_X.pages_[obj >> 0xc]->ptr_ + (ulong)((obj & 0xfff) * 0x18));
    local_30.val.obj = *local_38.p_ & 0x7f;
    local_30.typ = VM_INT;
    CVmObjList::cons_set_element(this,0,&local_30);
    local_30.typ = VM_INT;
    local_30.val.obj = (vm_obj_id_t)local_38.p_[1];
    CVmObjList::cons_set_element(this,1,&local_30);
    local_30.typ = ((char)*local_38.p_ < '\0') + VM_NIL;
    CVmObjList::cons_set_element(this,2,&local_30);
    CVmBif::retval_obj(obj);
    return;
  }
  err_throw(0x7dd);
}

Assistant:

void CVmBifTADS::get_func_params(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* set up a method header pointer for the function pointer argument */
    CVmFuncPtr hdr;
    if (!hdr.set(vmg_ G_stk->get(0)))
        err_throw(VMERR_FUNCPTR_VAL_REQD);

    /* 
     *   Allocate our return list.  We need three elements: [minArgs,
     *   optionalArgs, isVarargs].  
     */
    vm_obj_id_t lst_obj = CVmObjList::create(vmg_ FALSE, 3);

    /* get the list object, properly cast */
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

    /* set the minimum argument count */
    vm_val_t val;
    val.set_int(hdr.get_min_argc());
    lst->cons_set_element(0, &val);

    /* set the optional argument count */
    val.set_int(hdr.get_opt_argc());
    lst->cons_set_element(1, &val);

    /* set the varargs flag */
    val.set_logical(hdr.is_varargs());
    lst->cons_set_element(2, &val);

    /* return the list */
    retval_obj(vmg_ lst_obj);
}